

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O2

void Int8_To_UInt8(void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride
                  ,uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  bool bVar1;
  
  while (bVar1 = count != 0, count = count - 1, bVar1) {
    *(char *)destinationBuffer = *sourceBuffer + -0x80;
    sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride);
    destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride);
  }
  return;
}

Assistant:

static void Int8_To_UInt8(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    signed char *src = (signed char*)sourceBuffer;
    unsigned char *dest =  (unsigned char*)destinationBuffer;
    (void)ditherGenerator; /* unused parameter */

    while( count-- )
    {
        (*dest) = (unsigned char)(*src + 128);

        src += sourceStride;
        dest += destinationStride;
    }
}